

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O3

Up __thiscall yactfr::FixedLengthSignedIntegerType::_clone(FixedLengthSignedIntegerType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  DisplayBase local_4c;
  BitOrder local_48;
  ByteOrder local_44;
  uint local_40;
  uint local_3c;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  undefined1 local_30 [8];
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_28;
  
  local_3c = *(uint *)(in_RSI + 0xc);
  local_40 = *(uint *)(in_RSI + 0x18);
  local_44 = *(ByteOrder *)(in_RSI + 0x1c);
  local_48 = *(BitOrder *)(in_RSI + 0x20);
  local_4c = *(DisplayBase *)(in_RSI + 0x28);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffd8,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    _Var1._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffd8);
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       _Var1._M_head_impl;
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthSignedIntegerType *)local_30,&local_3c,&local_40,&local_44,&local_48,
             &local_4c,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>_>_>_>
              *)(in_RSI + 0x30),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  (this->super_FixedLengthIntegerType<long_long>).super_FixedLengthBitArrayType.super_ScalarDataType
  .super_DataType._vptr_DataType = (_func_int **)local_30;
  local_30 = (undefined1  [8])0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthSignedIntegerType::_clone() const
{
    return FixedLengthSignedIntegerType::create(this->alignment(), this->length(),
                                                this->byteOrder(), this->bitOrder(),
                                                this->preferredDisplayBase(), this->mappings(),
                                                internal::tryCloneAttrs(this->attributes()));
}